

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsBindAny(CNetAddr *this)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  if (1 < this->m_net - NET_IPV4) {
    bVar7 = false;
    goto LAB_00a96588;
  }
  uVar2 = (this->m_addr)._size;
  if (0x10 < uVar2) {
    this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    uVar2 = uVar2 - 0x11;
  }
  pcVar1 = (this->m_addr)._union.direct + (int)uVar2;
  pcVar4 = (this->m_addr)._union.direct + 1;
  for (iVar3 = (int)uVar2 >> 2; 0 < iVar3; iVar3 = iVar3 + -1) {
    if (pcVar4[-1] != '\0') {
      pcVar5 = pcVar4 + -1;
      goto LAB_00a96582;
    }
    pcVar5 = pcVar4;
    if (*pcVar4 != '\0') goto LAB_00a96582;
    if (pcVar4[1] != '\0') {
      pcVar5 = pcVar4 + 1;
      goto LAB_00a96582;
    }
    if (pcVar4[2] != '\0') {
      pcVar5 = pcVar4 + 2;
      goto LAB_00a96582;
    }
    pcVar4 = pcVar4 + 4;
    uVar2 = uVar2 - 4;
  }
  pcVar6 = pcVar4 + -1;
  if (uVar2 == 1) {
LAB_00a965a9:
    pcVar5 = pcVar6;
    if (*pcVar6 == '\0') {
      pcVar5 = pcVar1;
    }
  }
  else if (uVar2 == 3) {
    pcVar5 = pcVar6;
    if (*pcVar6 == '\0') goto LAB_00a9659e;
  }
  else {
    pcVar5 = pcVar1;
    pcVar4 = pcVar6;
    if (uVar2 == 2) {
LAB_00a9659e:
      pcVar5 = pcVar4;
      if (*pcVar5 == '\0') {
        pcVar6 = pcVar5 + 1;
        goto LAB_00a965a9;
      }
    }
  }
LAB_00a96582:
  bVar7 = pcVar5 == pcVar1;
LAB_00a96588:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool CNetAddr::IsBindAny() const
{
    if (!IsIPv4() && !IsIPv6()) {
        return false;
    }
    return std::all_of(m_addr.begin(), m_addr.end(), [](uint8_t b) { return b == 0; });
}